

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool P_HitFriend(AActor *self)

{
  DObject *distance;
  undefined1 auVar1 [8];
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  AActor *pAVar5;
  bool local_69;
  undefined1 local_68 [24];
  DObject *local_50;
  double dist;
  DAngle angle;
  undefined1 local_38 [8];
  FTranslatedLineTarget t;
  AActor *self_local;
  
  t._24_8_ = self;
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)local_38);
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&angle.Degrees + 4),
             t._24_4_ +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&angle.Degrees + 4));
  local_69 = false;
  if (uVar4 != 0) {
    local_69 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(t._24_8_ + 0x208),(AActor *)0x0);
  }
  uVar2 = t._24_8_;
  if (local_69 != false) {
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(t._24_8_ + 0x208));
    AActor::AngleTo((AActor *)&dist,(AActor *)uVar2,SUB81(pAVar5,0));
    uVar2 = t._24_8_;
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(t._24_8_ + 0x208));
    local_50 = (DObject *)AActor::Distance2D((AActor *)uVar2,pAVar5,false);
    uVar2 = t._24_8_;
    TAngle<double>::TAngle((TAngle<double> *)(local_68 + 0x10),(TAngle<double> *)&dist);
    distance = local_50;
    TAngle<double>::TAngle((TAngle<double> *)(local_68 + 8),0.0);
    P_AimLineAttack((AActor *)local_68,(DAngle *)uVar2,(double)distance,
                    (FTranslatedLineTarget *)(local_68 + 0x10),(DAngle *)local_38,(int)local_68 + 8,
                    (AActor *)0x1,(AActor *)0x0);
    auVar1 = local_38;
    if ((local_38 != (undefined1  [8])0x0) &&
       (pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(t._24_8_ + 0x208)),
       auVar1 != (undefined1  [8])pAVar5)) {
      bVar3 = AActor::IsFriend((AActor *)t._24_8_,(AActor *)local_38);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool P_HitFriend(AActor * self)
{
	FTranslatedLineTarget t;

	if (self->flags&MF_FRIENDLY && self->target != NULL)
	{
		DAngle angle = self->AngleTo(self->target);
		double dist = self->Distance2D(self->target);
		P_AimLineAttack (self, angle, dist, &t, 0., true);
		if (t.linetarget != NULL && t.linetarget != self->target)
		{
			return self->IsFriend (t.linetarget);
		}
	}
	return false;
}